

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PField * __thiscall PClass::AddField(PClass *this,FName *name,PType *type,DWORD flags)

{
  BYTE *pBVar1;
  FName local_34;
  PField *local_30;
  PField *field;
  uint oldsize;
  DWORD flags_local;
  PType *type_local;
  FName *name_local;
  PClass *this_local;
  
  field._0_4_ = *(uint *)((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                                 super_PCompoundType.super_PType.super_PTypeBase.super_DObject +
                         0x24);
  field._4_4_ = flags;
  _oldsize = type;
  type_local = (PType *)name;
  name_local = (FName *)this;
  FName::FName(&local_34,name);
  local_30 = PStruct::AddField((PStruct *)this,&local_34,_oldsize,field._4_4_);
  if (((local_30 != (PField *)0x0) && ((field._4_4_ & 8) == 0)) && (this->Defaults != (BYTE *)0x0))
  {
    pBVar1 = (BYTE *)M_Realloc_Dbg(this->Defaults,
                                   (ulong)*(uint *)((long)&(this->super_PNativeStruct).super_PStruct
                                                           .super_PNamedType.super_PCompoundType.
                                                           super_PType.super_PTypeBase.super_DObject
                                                   + 0x24),
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                                   ,0xd24);
    this->Defaults = pBVar1;
    memset(this->Defaults + (uint)field,0,
           (ulong)(*(int *)((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                                   super_PCompoundType.super_PType.super_PTypeBase.super_DObject +
                           0x24) - (uint)field));
  }
  return local_30;
}

Assistant:

PField *PClass::AddField(FName name, PType *type, DWORD flags)
{
	unsigned oldsize = Size;
	PField *field = Super::AddField(name, type, flags);

	// Only initialize the defaults if they have already been created.
	// For ZScript this is not the case, it will first define all fields before
	// setting up any defaults for any class.
	if (field != nullptr && !(flags & VARF_Native) && Defaults != nullptr)
	{
		Defaults = (BYTE *)M_Realloc(Defaults, Size);
		memset(Defaults + oldsize, 0, Size - oldsize);
	}
	return field;
}